

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall TApp_OneStringEqualVersion_Test::TestBody(TApp_OneStringEqualVersion_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d8;
  AssertHelper local_1a0;
  Message local_198;
  undefined1 local_190 [8];
  AssertionResult gtest_ar_2;
  Message local_178;
  allocator local_169;
  string local_168;
  size_t local_148;
  unsigned_long local_140;
  undefined1 local_138 [8];
  AssertionResult gtest_ar_1;
  Message local_120;
  allocator local_111;
  string local_110;
  size_t local_f0;
  unsigned_long local_e8;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  iterator local_a0;
  size_type local_98;
  allocator local_89;
  string local_88;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  string str;
  TApp_OneStringEqualVersion_Test *this_local;
  
  str.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"-s,--string",&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_88,"",&local_89);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (&(this->super_TApp).app,&local_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,&local_88
            );
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  gtest_ar.message_.ptr_._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_c0,"--string=mystring",
             (allocator *)((long)&gtest_ar.message_.ptr_ + 7));
  gtest_ar.message_.ptr_._6_1_ = 0;
  local_a0 = &local_c0;
  local_98 = 1;
  __l._M_len = 1;
  __l._M_array = local_a0;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l);
  local_1d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0;
  do {
    local_1d8 = local_1d8 + -1;
    std::__cxx11::string::~string((string *)local_1d8);
  } while (local_1d8 != &local_c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  TApp::run(&this->super_TApp);
  local_e8 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_110,"-s",&local_111);
  local_f0 = CLI::App::count(&(this->super_TApp).app,&local_110);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_e0,"(size_t)1","app.count(\"-s\")",&local_e8,&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x41,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  local_140 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_168,"--string",&local_169);
  local_148 = CLI::App::count(&(this->super_TApp).app,&local_168);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_138,"(size_t)1","app.count(\"--string\")",&local_140,
             &local_148);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(&local_178);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x42,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[9]>
            ((EqHelper<false> *)local_190,"str","\"mystring\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
             (char (*) [9])0x1cd117);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
  if (!bVar1) {
    testing::Message::Message(&local_198);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x43,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1a0,&local_198);
    testing::internal::AssertHelper::~AssertHelper(&local_1a0);
    testing::Message::~Message(&local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST_F(TApp, OneStringEqualVersion) {
    std::string str;
    app.add_option("-s,--string", str);
    args = {"--string=mystring"};
    run();
    EXPECT_EQ((size_t)1, app.count("-s"));
    EXPECT_EQ((size_t)1, app.count("--string"));
    EXPECT_EQ(str, "mystring");
}